

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf8.cxx
# Opt level: O0

char * fl_utf2mbcs(char *s)

{
  char *s_local;
  
  s_local = s;
  if (s == (char *)0x0) {
    s_local = (char *)0x0;
  }
  return s_local;
}

Assistant:

char * fl_utf2mbcs(const char *s)
{
  if (!s) return NULL;

#if defined(WIN32) && !defined(__CYGWIN__)

  size_t l = strlen(s);
  static char *buf = NULL;

  unsigned wn = fl_utf8toUtf16(s, (unsigned) l, NULL, 0) + 7; // Query length
  mbwbuf = (xchar*)realloc(mbwbuf, sizeof(xchar)*wn);
  l = fl_utf8toUtf16(s, (unsigned) l, (unsigned short *)mbwbuf, wn); // Convert string
  mbwbuf[l] = 0;

  buf = (char*)realloc(buf, (unsigned) (l * 6 + 1));
  l = (unsigned) wcstombs(buf, mbwbuf, (unsigned) l * 6);
  buf[l] = 0;
  return buf;
#else
  return (char*) s;
#endif
}